

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_448ecb::IntegerExpr::printLeft(IntegerExpr *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (3 < (ulong)((long)(this->Type).Last - (long)(this->Type).First)) {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '(';
    S->CurrentPosition = S->CurrentPosition + 1;
    pcVar1 = (this->Type).First;
    sVar2 = (long)(this->Type).Last - (long)pcVar1;
    if (sVar2 != 0) {
      OutputStream::grow(S,sVar2);
      memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar2);
      S->CurrentPosition = S->CurrentPosition + sVar2;
    }
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = ')';
    S->CurrentPosition = S->CurrentPosition + 1;
  }
  pcVar1 = (this->Value).First;
  if (*pcVar1 == 'n') {
    OutputStream::grow(S,1);
    S->Buffer[S->CurrentPosition] = '-';
    S->CurrentPosition = S->CurrentPosition + 1;
    pcVar1 = (this->Value).First;
    pcVar3 = (this->Value).Last;
    pcVar1 = pcVar1 + (pcVar3 != pcVar1);
  }
  else {
    pcVar3 = (this->Value).Last;
  }
  sVar2 = (long)pcVar3 - (long)pcVar1;
  if (sVar2 != 0) {
    OutputStream::grow(S,sVar2);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar2);
    S->CurrentPosition = S->CurrentPosition + sVar2;
  }
  pcVar1 = (this->Type).First;
  if (((ulong)((long)(this->Type).Last - (long)pcVar1) < 4) &&
     (sVar2 = (long)(this->Type).Last - (long)pcVar1, sVar2 != 0)) {
    OutputStream::grow(S,sVar2);
    memmove(S->Buffer + S->CurrentPosition,pcVar1,sVar2);
    S->CurrentPosition = S->CurrentPosition + sVar2;
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Type.size() > 3) {
      S += "(";
      S += Type;
      S += ")";
    }

    if (Value[0] == 'n') {
      S += "-";
      S += Value.dropFront(1);
    } else
      S += Value;

    if (Type.size() <= 3)
      S += Type;
  }